

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiNavLayer in_EDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiWindow *window;
  ImGuiWindow *prev_nav_window;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffe8;
  ImGuiID focus_scope_id;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  
  focus_scope_id = (ImGuiID)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  pIVar3 = GImGui;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar2 = GImGui->NavWindow;
    pIVar1 = NavRestoreLastChildNavWindow(GImGui->NavWindow);
    pIVar3->NavWindow = pIVar1;
    pIVar3->NavLastValidSelectionUserData = -1;
    if ((pIVar2 != (ImGuiWindow *)0x0) && ((pIVar3->DebugLogFlags & 2U) != 0)) {
      DebugLog("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n",pIVar2->Name,
               pIVar3->NavWindow->Name);
    }
    focus_scope_id = (ImGuiID)((ulong)pIVar2 >> 0x20);
  }
  if (pIVar3->NavWindow->NavLastIds[in_EDI] == 0) {
    pIVar3->NavLayer = in_EDI;
    NavInitWindow(unaff_retaddr,SUB41(in_EDI >> 0x18,0));
  }
  else {
    SetNavID((ImGuiID)((ulong)pIVar3 >> 0x20),(ImGuiNavLayer)pIVar3,focus_scope_id,
             (ImRect *)pIVar3->NavWindow);
  }
  return;
}

Assistant:

void ImGui::NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    if (layer == ImGuiNavLayer_Main)
    {
        ImGuiWindow* prev_nav_window = g.NavWindow;
        g.NavWindow = NavRestoreLastChildNavWindow(g.NavWindow);    // FIXME-NAV: Should clear ongoing nav requests?
        g.NavLastValidSelectionUserData = ImGuiSelectionUserData_Invalid;
        if (prev_nav_window)
            IMGUI_DEBUG_LOG_FOCUS("[focus] NavRestoreLayer: from \"%s\" to SetNavWindow(\"%s\")\n", prev_nav_window->Name, g.NavWindow->Name);
    }
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
    {
        SetNavID(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
    }
    else
    {
        g.NavLayer = layer;
        NavInitWindow(window, true);
    }
}